

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::WriteObjectUserData(ON_BinaryArchive *this,ON_Object *object)

{
  ON_Object *pOVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  undefined7 extraout_var;
  ON_UserData *this_00;
  ON_ClassId *pOVar6;
  char *pcVar7;
  ON_UnknownUserData *pOVar8;
  long lVar9;
  ON_3DM_BIG_CHUNK *pOVar10;
  byte bVar11;
  ON_UserData *p;
  int *piVar12;
  byte bVar13;
  bool bVar14;
  ON_UUID local_98;
  uint local_84;
  ON_Object *local_80;
  ON_ClassId *local_78;
  int *local_70;
  ON_UUID *local_68;
  uint local_5c;
  ON_UnknownUserData *local_58;
  ON_UUID *local_50;
  ON_SimpleArray<ON_UUID_struct> *local_48;
  ON_UUID local_40;
  undefined4 extraout_var_00;
  
  bVar14 = true;
  if (2 < this->m_3dm_version) {
    uVar5 = (ulong)(uint)(this->m_user_data_filter).m_count;
    if (uVar5 == 0) {
      bVar11 = 1;
    }
    else {
      lVar9 = 0;
      do {
        bVar11 = *(byte *)((long)(&((this->m_user_data_filter).m_a)->m_item_id + 1) + lVar9 + 4);
        if (bVar11 == 0) break;
        bVar14 = uVar5 * 0x28 + -0x28 != lVar9;
        lVar9 = lVar9 + 0x28;
      } while (bVar14);
    }
    bVar13 = 0;
    if ((uVar5 != 0) && (bVar11 == 0)) {
      lVar9 = 0;
      do {
        bVar13 = *(byte *)((long)(&((this->m_user_data_filter).m_a)->m_item_id + 1) + lVar9 + 4);
        if (bVar13 != 0) break;
        bVar14 = uVar5 * 0x28 + -0x28 != lVar9;
        lVar9 = lVar9 + 0x28;
      } while (bVar14);
    }
    if (bVar11 == 0) {
      bVar14 = ObjectHasUserDataToWrite(this,object);
      local_84 = (uint)CONCAT71(extraout_var,bVar14) ^ 1;
    }
    else {
      local_84 = 0;
    }
    local_80 = object;
    this_00 = ON_Object::FirstUserData(object);
    if (this_00 == (ON_UserData *)0x0) {
      bVar14 = true;
      p = (ON_UserData *)0x0;
    }
    else {
      local_70 = &this->m_3dm_version;
      local_48 = &this->m_V3_plugin_id_list;
      local_5c = (uint)(bVar13 | bVar11);
      local_50 = (ON_UUID *)&this->m_3dm_opennurbs_version;
      bVar14 = true;
      p = (ON_UserData *)0x0;
      do {
        if (((p != (ON_UserData *)0x0) && (p->m_userdata_next == this_00)) &&
           (bVar2 = ON_Object::DetachUserData(local_80,p), bVar2)) {
          (*(p->super_ON_Object)._vptr_ON_Object[4])(p);
        }
        pOVar1 = local_80;
        iVar3 = (*(this_00->super_ON_Object)._vptr_ON_Object[0x1b])(this_00,this,local_80);
        p = (ON_UserData *)0x0;
        if ((char)iVar3 != '\0') {
          p = this_00;
        }
        if (((char)local_84 == '\0') &&
           (iVar3 = (*(this_00->super_ON_Object)._vptr_ON_Object[0x1a])(this_00,this,pOVar1),
           (char)iVar3 != '\0')) {
          local_68 = &this_00->m_userdata_uuid;
          iVar3 = ON_UuidCompare(local_68,&ON_nil_uuid);
          if ((iVar3 != 0) && (this_00->m_userdata_owner == local_80)) {
            iVar3 = (**(this_00->super_ON_Object)._vptr_ON_Object)(this_00);
            pOVar6 = (ON_ClassId *)CONCAT44(extraout_var_00,iVar3);
            if (((pOVar6 != &ON_Object::m_ON_Object_class_rtti) && (pOVar6 != (ON_ClassId *)0x0)) &&
               (pOVar6 != &ON_UserData::m_ON_UserData_class_rtti)) {
              local_78 = pOVar6;
              local_40 = ON_UserData::UserDataClassUuid(this_00);
              iVar3 = ON_UuidCompare(&local_40,&ON_nil_uuid);
              if (iVar3 != 0) {
                local_98 = ON_ClassId::Uuid(&ON_UserData::m_ON_UserData_class_rtti);
                iVar3 = ON_UuidCompare(&local_40,&local_98);
                if (iVar3 != 0) {
                  local_98 = ON_ClassId::Uuid(&ON_Object::m_ON_Object_class_rtti);
                  iVar3 = ON_UuidCompare(&local_40,&local_98);
                  if (iVar3 != 0) {
                    local_98 = ON_ClassId::Uuid(&ON_UnknownUserData::m_ON_UnknownUserData_class_rtti
                                               );
                    iVar3 = ON_UuidCompare(&local_40,&local_98);
                    if (iVar3 != 0) {
                      local_98 = ON_ClassId::Uuid(&ON_ObsoleteUserData::
                                                   m_ON_ObsoleteUserData_class_rtti);
                      iVar3 = ON_UuidCompare(&local_40,&local_98);
                      if (((iVar3 != 0) &&
                          ((*local_70 != 3 ||
                           (iVar3 = ON_SimpleArray<ON_UUID_struct>::BinarySearch
                                              (local_48,&this_00->m_application_uuid,ON_UuidCompare)
                           , -1 < iVar3)))) &&
                         ((bVar11 != 0 ||
                          (bVar2 = ShouldSerializeUserDataItem
                                             (this,this_00->m_application_uuid,
                                              this_00->m_userdata_uuid), bVar2)))) {
                        bVar2 = ON_UuidIsNil(&this_00->m_application_uuid);
                        if (bVar2) {
                          pcVar7 = ON_ClassId::ClassName(local_78);
                          ON_Error("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                                   ,0x130f,"Not saving %s userdata - m_application_uuid is nil.",
                                   pcVar7);
                        }
                        else {
                          local_78 = (ON_ClassId *)&this_00->m_application_uuid;
                          pOVar8 = ON_UnknownUserData::Cast(&this_00->super_ON_Object);
                          bVar2 = ON_UserData::IsUnknownUserData(this_00);
                          if (pOVar8 == (ON_UnknownUserData *)0x0) {
                            if (!bVar2) goto LAB_0039d520;
                            iVar3 = 0x131a;
                            pcVar7 = 
                            "ON_UnknownUserData::Cast(ud) is null and ud->IsUnknownUserData() is true."
                            ;
                          }
                          else {
                            if (bVar2) {
LAB_0039d520:
                              if (((pOVar8 == (ON_UnknownUserData *)0x0) ||
                                  (((((char)local_5c != '\0' &&
                                     (iVar3 = pOVar8->m_3dm_version, 0x2b < iVar3 - 6U && 3 < iVar3)
                                     ) && (0xbf67451 < pOVar8->m_3dm_opennurbs_version_number)) &&
                                   ((iVar3 < 0x32 || (0x31 < *local_70)))))) &&
                                 (bVar14 = BeginWrite3dmBigChunk(this,0x27ffd,0), bVar14)) {
                                local_98.Data1._0_1_ = 0x22;
                                local_58 = pOVar8;
                                Write(this,1,&local_98);
                                bVar2 = BeginWrite3dmBigChunk(this,0x2fff9,0);
                                if (bVar2) {
                                  bVar14 = WriteUuid(this,&local_40);
                                  if (bVar14) {
                                    bVar14 = WriteUuid(this,local_68);
                                  }
                                  if (bVar14 != false) {
                                    local_98.Data1 = this_00->m_userdata_copycount;
                                    bVar14 = WriteInt32(this,1,(ON__INT32 *)&local_98);
                                  }
                                  if (bVar14 != false) {
                                    bVar14 = WriteDouble(this,0x10,
                                                         (double *)&this_00->m_userdata_xform);
                                  }
                                  if (bVar14 != false) {
                                    bVar14 = WriteUuid(this,(ON_UUID *)local_78);
                                  }
                                  if (bVar14 != false) {
                                    local_68 = (ON_UUID *)&local_58->m_3dm_opennurbs_version_number;
                                    if (local_58 == (ON_UnknownUserData *)0x0) {
                                      local_68 = local_50;
                                    }
                                    piVar12 = &local_58->m_3dm_version;
                                    if (local_58 == (ON_UnknownUserData *)0x0) {
                                      piVar12 = local_70;
                                    }
                                    WriteBool(this,local_58 != (ON_UnknownUserData *)0x0);
                                    uVar4 = *piVar12;
                                    local_98.Data1 = uVar4;
                                    bVar14 = WriteInt32(this,1,(ON__INT32 *)&local_98);
                                    uVar4 = ArchiveOpenNURBSVersionToWrite(uVar4,local_68->Data1);
                                    if (bVar14) {
                                      local_98.Data1 = uVar4;
                                      bVar14 = WriteInt32(this,1,(ON__INT32 *)&local_98);
                                    }
                                  }
                                  bVar2 = EndWrite3dmChunk(this);
                                  bVar2 = (bool)(bVar2 & bVar14);
                                }
                                if ((bVar2 != false) &&
                                   (bVar2 = BeginWrite3dmBigChunk(this,0x40008000,0), bVar2)) {
                                  if (local_58 != (ON_UnknownUserData *)0x0) {
                                    lVar9 = (long)(this->m_chunk).m_count;
                                    pOVar10 = (this->m_chunk).m_a + lVar9 + -1;
                                    if (lVar9 < 1) {
                                      pOVar10 = (ON_3DM_BIG_CHUNK *)0x0;
                                    }
                                    pOVar10->m_do_crc16 = '\0';
                                    pOVar10 = (this->m_chunk).m_a + lVar9 + -1;
                                    if (lVar9 < 1) {
                                      pOVar10 = (ON_3DM_BIG_CHUNK *)0x0;
                                    }
                                    pOVar10->m_do_crc32 = '\0';
                                    this->m_bDoChunkCRC = false;
                                  }
                                  if (this->m_user_data_depth < 0) {
                                    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                                               ,0x137d,"","m_user_data_depth < 0");
                                    this->m_user_data_depth = 0;
                                  }
                                  this->m_user_data_depth = this->m_user_data_depth + 1;
                                  iVar3 = (*(this_00->super_ON_Object)._vptr_ON_Object[10])
                                                    (this_00,this);
                                  this->m_user_data_depth = this->m_user_data_depth + -1;
                                  bVar2 = EndWrite3dmChunk(this);
                                  bVar2 = (bool)(bVar2 & (byte)iVar3);
                                }
                                bVar14 = EndWrite3dmChunk(this);
                                bVar14 = (bool)(bVar14 & bVar2);
                              }
                              goto LAB_0039d323;
                            }
                            iVar3 = 0x1322;
                            pcVar7 = 
                            "ON_UnknownUserData::Cast(ud) is not null and ud->IsUnknownUserData() is false."
                            ;
                          }
                          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                                     ,iVar3,"",pcVar7);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_0039d323:
        this_00 = this_00->m_userdata_next;
      } while ((this_00 != (ON_UserData *)0x0) && (bVar14 != false));
    }
    if ((p != (ON_UserData *)0x0) &&
       ((p->m_userdata_next == (ON_UserData *)0x0 &&
        (bVar2 = ON_Object::DetachUserData(local_80,p), bVar2)))) {
      (*(p->super_ON_Object)._vptr_ON_Object[4])(p);
    }
  }
  return bVar14;
}

Assistant:

bool ON_BinaryArchive::WriteObjectUserData( const ON_Object& object )
{
  if ( m_3dm_version < 3 )
  {
    // no user data is saved in V1 and V2 files.
    return true;
  }

  const bool bSaveAllUserData = ShouldSerializeAllUserData();
  const bool bSaveSelectedUserData = bSaveAllUserData ? false : ShouldSerializeSomeUserData();
  const bool bHasWritableUserData = (bSaveAllUserData || ObjectHasUserDataToWrite(&object));

  // writes user data attached to object.
  bool rc = true;
  const ON_UserData* ud;
  ON_UUID userdata_classid;

  ON_UserData* delete_this_ud = 0;
  
  for (ud = object.FirstUserData(); ud && rc; ud = ud->m_userdata_next) 
  {
    if (0 != delete_this_ud)
    {
      if (delete_this_ud->m_userdata_next == ud)
      {
        if (const_cast<ON_Object&>(object).DetachUserData(delete_this_ud))
          delete delete_this_ud;
      }
      delete_this_ud = 0;
    }

    if (ud->DeleteAfterWrite(*this,&object))
      delete_this_ud = const_cast< ON_UserData* >(ud);

    if (false == bHasWritableUserData)
      continue;

    if (!ud->WriteToArchive(*this,&object))
      continue;

    // LOTS of tests to weed out bogus user data
    if ( 0 == ON_UuidCompare( ud->m_userdata_uuid, ON_nil_uuid ) )
      continue;
    if ( &object != ud->m_userdata_owner )
      continue;
    const ON_ClassId* cid = ud->ClassId();
    if ( 0 == cid )
      continue;
    if ( cid == &ON_CLASS_RTTI(ON_UserData) )
      continue;
    if ( cid == &ON_CLASS_RTTI(ON_Object) )
      continue;

    // The UserDataClassUuid() function is used instead of 
    // calling cid->Uuid() so we get the value of the 
    // plug-in's class id when the plug-in is not loaded
    // and ud is ON_UnknownUserData.
    userdata_classid = ud->UserDataClassUuid();
    if ( 0 == ON_UuidCompare( userdata_classid, ON_nil_uuid ) )
      continue;
    if ( 0 == ON_UuidCompare( userdata_classid, ON_CLASS_ID(ON_UserData) ) )
      continue;
    if ( 0 == ON_UuidCompare( userdata_classid, ON_CLASS_ID(ON_Object) ) )
      continue;
    if (0 == ON_UuidCompare(userdata_classid, ON_CLASS_ID(ON_UnknownUserData)))
      continue;
    if (0 == ON_UuidCompare(userdata_classid, ON_CLASS_ID(ON_ObsoleteUserData)))
      continue;

    if ( 3 == m_3dm_version )
    {
      // When saving a V3 archive and the user data is not
      // native V3 data, make sure the plug-in supports
      // writing V3 user data.
      if ( m_V3_plugin_id_list.BinarySearch( &ud->m_application_uuid, ON_UuidCompare ) < 0 )
        continue;
    }

    if (false == bSaveAllUserData 
        && false == ShouldSerializeUserDataItem(ud->m_application_uuid, ud->m_userdata_uuid)
       )
      continue;

    if ( ON_UuidIsNil( ud->m_application_uuid ) )
    {
      // As of version 200909190 - a non-nil application_uuid is 
      // required in order for user data to be saved in a 
      // 3dm archive.
      ON_Error(__FILE__,__LINE__,"Not saving %s userdata - m_application_uuid is nil.",cid->ClassName());
      continue; 
    }

    // See if we have unknown user data (goo) and make sure
    // IsUnknownUserData() agrees with ON_UnknownUserData::Cast().
    const ON_UnknownUserData* unknown_ud = ON_UnknownUserData::Cast(ud);
    if ( 0 == unknown_ud )
    {
      if ( ud->IsUnknownUserData() )
      {
        ON_ERROR("ON_UnknownUserData::Cast(ud) is null and ud->IsUnknownUserData() is true.");
        continue; // something's wrong
      }
    }
    else
    {
      if ( !ud->IsUnknownUserData() )
      {
        ON_ERROR("ON_UnknownUserData::Cast(ud) is not null and ud->IsUnknownUserData() is false.");
        continue; // something's wrong
      }
    }

    if ( 0 != unknown_ud )
    {
      if (false == bSaveAllUserData && false == bSaveSelectedUserData)
        continue; // unknown user data cannot be critical

      if ( unknown_ud->m_3dm_version <= 3 )
        continue; // Unknown will not be resaved in V3 archives

      if ( unknown_ud->m_3dm_version > 5 && unknown_ud->m_3dm_version < 50 )
        continue;

      if ( unknown_ud->m_3dm_opennurbs_version_number < 200701010 )
        continue;

      if ( unknown_ud->m_3dm_version >= 50 && m_3dm_version < 50 )
      {
        // Unknown userdata with 8 byte chunk lengths cannot be
        // saved into a V4 file with 4 byte chunk lengths because
        // the resulting chunk will be unreadable in V4.
        // This is not an error condition.  It is a consequence
        // of V4 IO code not being robust enough to handle
        // 8 bytes chunk lengths.
        continue;
      }
    }

    // Each piece of user data is inside of 
    // a TCODE_OPENNURBS_CLASS_USERDATA chunk.
    rc = BeginWrite3dmChunk( TCODE_OPENNURBS_CLASS_USERDATA, 0 );
    if (rc) {
      rc = Write3dmChunkVersion(2,2);
      // wrap user data header info in an TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk
      rc = BeginWrite3dmChunk( TCODE_OPENNURBS_CLASS_USERDATA_HEADER, 0 );
      if (rc) 
      {
        if ( rc ) rc = WriteUuid( userdata_classid );
        if ( rc ) rc = WriteUuid( ud->m_userdata_uuid );
        if ( rc ) rc = WriteInt( ud->m_userdata_copycount );
        if ( rc ) rc = WriteXform( ud->m_userdata_xform );

        // added for version 2.1
        if ( rc ) rc = WriteUuid( ud->m_application_uuid );

        // added for version 2.2 - 14, October 2009
        if ( rc )
        {
          rc = WriteBool( unknown_ud ? true : false );
          // ver = 2,3,4,50,60,...
          const int file_format_ver = unknown_ud ? unknown_ud->m_3dm_version : m_3dm_version;
          rc = WriteInt(file_format_ver);
          // ver = opennurbs version number
          unsigned int app_ver = unknown_ud ? unknown_ud->m_3dm_opennurbs_version_number : m_3dm_opennurbs_version;
          unsigned int app_ver_to_write = ON_BinaryArchive::ArchiveOpenNURBSVersionToWrite(file_format_ver, app_ver);
          if (rc) rc = WriteInt(app_ver_to_write);
        }

        if ( !EndWrite3dmChunk() )
          rc = false;
      }
      if (rc) 
      {
        // wrap user data in an anonymous chunk
        rc = BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
        if ( rc ) 
        {
          if ( 0 != unknown_ud )
          {
            // 22 January 2004 Dale Lear
            //   Disable crc checking when writing the
            //   unknow user data block.
            //   This has to be done so we don't get an extra
            //   32 bit CRC calculated on the block that
            //   ON_UnknownUserData::Write() writes.  The
            //   original 32 bit crc is at the end of this
            //   block and will be checked when the class
            //   that wrote this user data is present.
            //   The EndWrite3dmChunk() will reset the
            //   CRC checking flags to the appropriate
            //   values.
            m_chunk.Last()->m_do_crc16 = 0;
            m_chunk.Last()->m_do_crc32 = 0;
            m_bDoChunkCRC = false;
          }

          if (m_user_data_depth < 0)
          {
            ON_ERROR("m_user_data_depth < 0");
            m_user_data_depth = 0;
          }
          m_user_data_depth++;
          rc = ud->Write(*this)?true:false;
          m_user_data_depth--;
          if ( !EndWrite3dmChunk() )
            rc = false;
        }
      }
      if ( !EndWrite3dmChunk() )
        rc = false;
    }
  }


  if (0 != delete_this_ud)
  {
    if (0 == delete_this_ud->m_userdata_next)
    {
      if (const_cast<ON_Object&>(object).DetachUserData(delete_this_ud))
        delete delete_this_ud;
    }
    delete_this_ud = 0;
  }

  return rc;
}